

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int send_buffer(socket_server *ss,socket *s,socket_message *result)

{
  wb_list *list;
  wb_list *list_00;
  write_buffer *pwVar1;
  write_buffer *pwVar2;
  int iVar3;
  uint32_t local_34;
  socket *local_30;
  
  pwVar1 = (s->low).head;
  if ((pwVar1 != (write_buffer *)0x0) && (pwVar1->ptr != (char *)pwVar1->buffer)) {
    __assert_fail("!list_uncomplete(&s->low)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                  ,0x259,
                  "int send_buffer(struct socket_server *, struct socket *, struct socket_message *)"
                 );
  }
  list = &s->high;
  iVar3 = send_list(ss,s,list,result);
  if (iVar3 == 1) {
    return 1;
  }
  if (list->head == (write_buffer *)0x0) {
    list_00 = &s->low;
    if (list_00->head == (write_buffer *)0x0) {
      local_34 = 1;
      local_30 = s;
      epoll_ctl(ss->event_fd,3,s->fd,(epoll_event *)&local_34);
      if (s->type != 6) {
        return -1;
      }
      force_close(ss,s,result);
      return 1;
    }
    iVar3 = send_list(ss,s,list_00,result);
    if (iVar3 == 1) {
      return 1;
    }
    pwVar1 = list_00->head;
    if ((pwVar1 != (write_buffer *)0x0) && (pwVar1->ptr != (char *)pwVar1->buffer)) {
      pwVar2 = pwVar1->next;
      list_00->head = pwVar2;
      if (pwVar2 == (write_buffer *)0x0) {
        (s->low).tail = (write_buffer *)0x0;
      }
      if (list->head != (write_buffer *)0x0) {
        __assert_fail("high->head == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                      ,0x249,"void raise_uncomplete(struct socket *)");
      }
      pwVar1->next = (write_buffer *)0x0;
      (s->high).tail = pwVar1;
      (s->high).head = pwVar1;
    }
  }
  return -1;
}

Assistant:

static int
send_buffer(struct socket_server *ss, struct socket *s, struct socket_message *result) {
	assert(!list_uncomplete(&s->low));
	// step 1
	if (send_list(ss,s,&s->high,result) == SOCKET_CLOSE) {
		return SOCKET_CLOSE;
	}
	if (s->high.head == NULL) {
		// step 2
		if (s->low.head != NULL) {
			if (send_list(ss,s,&s->low,result) == SOCKET_CLOSE) {
				return SOCKET_CLOSE;
			}
			// step 3
			if (list_uncomplete(&s->low)) {
				raise_uncomplete(s);
			}
		} else {
			// step 4
			sp_write(ss->event_fd, s->fd, s, false);

			if (s->type == SOCKET_TYPE_HALFCLOSE) {
				force_close(ss, s, result);
				return SOCKET_CLOSE;
			}
		}
	}

	return -1;
}